

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Parser::CheckFunctionCallPart
          (Parser *this,FunctionSignaturePartsI *parts,size_t partsIndex,SymbolListCItr currSym,
          SymbolListCItr endSym,FunctionMatch *match)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  pointer pSVar6;
  reference __lhs;
  reference pvVar7;
  __tuple_element_t<1UL,_tuple<FunctionSignaturePartType,_unsigned_long,_bool>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<FunctionSignaturePartType,_unsigned_long,_bool>_> _Var9;
  size_type sVar10;
  bool local_271;
  undefined1 local_240 [8];
  FunctionMatch newMatch_2;
  tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> local_218;
  ulong local_200;
  size_t i_2;
  Symbol *local_1f0;
  FunctionMatch local_1e8;
  ulong local_1c8;
  size_t i_1;
  Symbol *local_1b8;
  undefined1 local_1b0 [8];
  FunctionMatch exprMatch;
  long local_188;
  size_t parenCount;
  size_t i;
  size_t local_160;
  size_t symCount;
  Parser *pPStack_150;
  bool isInitialToken;
  Symbol *local_148;
  undefined1 local_13d;
  undefined4 local_13c;
  int local_138;
  tuple<Jinx::Impl::FunctionSignaturePartType,_int,_bool> local_134;
  tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> local_128;
  undefined1 local_110 [8];
  FunctionMatch newMatch_1;
  undefined1 local_d0 [8];
  FunctionMatch newMatch;
  SymbolListCItr newCurrSym;
  int local_a0;
  tuple<Jinx::Impl::FunctionSignaturePartType,_int,_bool> local_9c;
  tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> local_90;
  reference local_78;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *name;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  *__range3;
  bool matchedName;
  value_type *part;
  FunctionMatch *match_local;
  size_t partsIndex_local;
  FunctionSignaturePartsI *parts_local;
  Parser *this_local;
  SymbolListCItr endSym_local;
  SymbolListCItr currSym_local;
  
  this_local = (Parser *)endSym._M_current;
  endSym_local = currSym;
  sVar4 = std::
          vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ::size(parts);
  if (sVar4 <= partsIndex) {
    currSym_local._M_current._7_1_ = 0;
    goto LAB_0016518b;
  }
  bVar2 = __gnu_cxx::operator==
                    (&endSym_local,
                     (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                      *)&this_local);
  if (bVar2) {
    currSym_local._M_current._7_1_ = 0;
    goto LAB_0016518b;
  }
  pvVar5 = std::
           vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ::operator[](parts,partsIndex);
  bVar2 = IsSymbolValid(this,endSym_local);
  if (!bVar2) {
    local_271 = false;
    if ((pvVar5->optional & 1U) != 0) {
      sVar4 = std::
              vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ::size(parts);
      local_271 = partsIndex == sVar4 - 1;
    }
    currSym_local._M_current._7_1_ = local_271;
    goto LAB_0016518b;
  }
  if (pvVar5->partType == Name) {
    if (((pvVar5->optional & 1U) == 0) &&
       (pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&endSym_local), pSVar6->type != NameValue)) {
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&endSym_local);
      bVar2 = IsKeyword(pSVar6->type);
      if (!bVar2) {
        currSym_local._M_current._7_1_ = 0;
        goto LAB_0016518b;
      }
    }
    bVar2 = false;
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ::begin(&pvVar5->names);
    name = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
           ::end(&pvVar5->names);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                                       *)&name), bVar3) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
              ::operator*(&__end3);
      local_78 = __lhs;
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&endSym_local);
      bVar3 = std::operator==(__lhs,&pSVar6->text);
      if (bVar3) {
        bVar2 = true;
        local_a0 = 0;
        newCurrSym._M_current._4_4_ = 1;
        std::make_tuple<Jinx::Impl::FunctionSignaturePartType,int,bool_const&>
                  ((FunctionSignaturePartType *)&local_9c,&local_a0,
                   (bool *)((long)&newCurrSym._M_current + 4));
        std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>::
        tuple<Jinx::Impl::FunctionSignaturePartType,_int,_bool,_true,_true>(&local_90,&local_9c);
        std::
        vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::push_back(&match->partData,&local_90);
        newMatch.partData.
        super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)endSym_local._M_current;
        __gnu_cxx::
        __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
        ::operator++((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                      *)&newMatch.partData.
                         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        FunctionMatch::FunctionMatch((FunctionMatch *)local_d0,match);
        bVar3 = CheckFunctionCallPart
                          (this,parts,partsIndex + 1,
                           (SymbolListCItr)
                           newMatch.partData.
                           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (SymbolListCItr)this_local,(FunctionMatch *)local_d0);
        if (bVar3) {
          FunctionMatch::operator=(match,(FunctionMatch *)local_d0);
          currSym_local._M_current._7_1_ = 1;
          newMatch_1.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        else {
          newMatch_1.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
        }
        FunctionMatch::~FunctionMatch((FunctionMatch *)local_d0);
        if ((uint)newMatch_1.partData.
                  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == 1) goto LAB_0016518b;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
      ::operator++(&__end3);
    }
    if ((!bVar2) && ((pvVar5->optional & 1U) != 0)) {
      FunctionMatch::FunctionMatch((FunctionMatch *)local_110,match);
      local_138 = 0;
      local_13c = 0;
      local_13d = 1;
      std::make_tuple<Jinx::Impl::FunctionSignaturePartType,int,bool>
                ((FunctionSignaturePartType *)&local_134,&local_138,(bool *)&local_13c);
      std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>::
      tuple<Jinx::Impl::FunctionSignaturePartType,_int,_bool,_true,_true>(&local_128,&local_134);
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::push_back((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   *)&newMatch_1,&local_128);
      local_148 = endSym_local._M_current;
      pPStack_150 = this_local;
      bVar2 = CheckFunctionCallPart
                        (this,parts,partsIndex + 1,endSym_local,(SymbolListCItr)this_local,
                         (FunctionMatch *)local_110);
      if (bVar2) {
        FunctionMatch::operator=(match,(FunctionMatch *)local_110);
        currSym_local._M_current._7_1_ = 1;
      }
      newMatch_1.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      newMatch_1.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = bVar2;
      FunctionMatch::~FunctionMatch((FunctionMatch *)local_110);
      goto joined_r0x00165151;
    }
  }
  else {
    sVar4 = std::
            vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::size(&match->partData);
    symCount._7_1_ = sVar4 <= partsIndex;
    local_160 = 0;
    bVar2 = CheckVariable(this,endSym_local,&local_160);
    if (((bVar2) || (bVar2 = CheckProperty(this,endSym_local,&local_160), bVar2)) ||
       (bVar2 = CheckFunctionDeclaration(this,endSym_local,&local_160), bVar2)) {
      for (parenCount = 0; parenCount < local_160; parenCount = parenCount + 1) {
        __gnu_cxx::
        __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
        ::operator++(&endSym_local);
      }
    }
    else {
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&endSym_local);
      if (pSVar6->type == ParenOpen) {
        local_188 = 1;
        local_160 = 1;
        while (local_188 != 0) {
          __gnu_cxx::
          __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
          ::operator++(&endSym_local);
          local_160 = local_160 + 1;
          exprMatch.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)endSym_local._M_current;
          bVar2 = IsSymbolValid(this,endSym_local);
          if (!bVar2) {
            currSym_local._M_current._7_1_ = 0;
            goto LAB_0016518b;
          }
          pSVar6 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                   ::operator->(&endSym_local);
          if (pSVar6->type == ParenOpen) {
            local_188 = local_188 + 1;
          }
          else {
            pSVar6 = __gnu_cxx::
                     __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                     ::operator->(&endSym_local);
            if (pSVar6->type == ParenClose) {
              local_188 = local_188 + -1;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
        ::operator++(&endSym_local);
      }
      else {
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&endSym_local);
        if (pSVar6->type == ParenClose) {
          currSym_local._M_current._7_1_ = 0;
          goto LAB_0016518b;
        }
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&endSym_local);
        bVar2 = IsConstant(pSVar6->type);
        if ((bVar2) ||
           (pSVar6 = __gnu_cxx::
                     __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                     ::operator->(&endSym_local), pSVar6->type == Not)) {
          __gnu_cxx::
          __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
          ::operator++(&endSym_local);
          local_160 = 1;
          goto LAB_00164f5d;
        }
        if ((symCount._7_1_ & 1) == 0) {
          pSVar6 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                   ::operator->(&endSym_local);
          bVar2 = IsOperator(pSVar6->type);
          if (((bVar2) ||
              (pSVar6 = __gnu_cxx::
                        __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        ::operator->(&endSym_local), pSVar6->type == And)) ||
             (pSVar6 = __gnu_cxx::
                       __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                       ::operator->(&endSym_local), pSVar6->type == Or)) {
            __gnu_cxx::
            __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
            ::operator++(&endSym_local);
            local_160 = 1;
            goto LAB_00164f5d;
          }
        }
        if (partsIndex == 0) {
          currSym_local._M_current._7_1_ = 0;
          goto LAB_0016518b;
        }
        local_1b8 = endSym_local._M_current;
        i_1 = (size_t)this_local;
        CheckFunctionCall((FunctionMatch *)local_1b0,this,false,endSym_local,
                          (SymbolListCItr)this_local);
        if (local_1b0 == (undefined1  [8])0x0) {
          local_1f0 = endSym_local._M_current;
          i_2 = (size_t)this_local;
          CheckFunctionCall(&local_1e8,this,true,endSym_local,(SymbolListCItr)this_local);
          FunctionMatch::operator=((FunctionMatch *)local_1b0,&local_1e8);
          FunctionMatch::~FunctionMatch(&local_1e8);
          if (local_1b0 != (undefined1  [8])0x0) {
            for (local_200 = 1; uVar1 = local_200,
                sVar4 = std::
                        vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                        ::size((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                *)&exprMatch), uVar1 < sVar4; local_200 = local_200 + 1) {
              __gnu_cxx::
              __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
              ::operator++(&endSym_local);
              local_160 = local_160 + 1;
            }
            goto LAB_00164f21;
          }
          currSym_local._M_current._7_1_ = 0;
          newMatch_1.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        else {
          for (local_1c8 = 0; uVar1 = local_1c8,
              sVar4 = std::
                      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ::size((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                              *)&exprMatch), uVar1 < sVar4; local_1c8 = local_1c8 + 1) {
            __gnu_cxx::
            __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
            ::operator++(&endSym_local);
            local_160 = local_160 + 1;
          }
LAB_00164f21:
          newMatch_1.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        }
        FunctionMatch::~FunctionMatch((FunctionMatch *)local_1b0);
        if ((uint)newMatch_1.partData.
                  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0016518b;
      }
    }
LAB_00164f5d:
    if ((symCount._7_1_ & 1) == 0) {
      pvVar7 = std::
               vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ::operator[](&match->partData,partsIndex);
      p_Var8 = std::get<1ul,Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>(pvVar7);
      _Var9 = *p_Var8 + local_160;
      pvVar7 = std::
               vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ::operator[](&match->partData,partsIndex);
      p_Var8 = std::get<1ul,Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>(pvVar7);
      *p_Var8 = _Var9;
    }
    else {
      newMatch_2.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      newMatch_2.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      std::make_tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long&,bool>
                (&local_218,
                 (FunctionSignaturePartType *)
                 ((long)&newMatch_2.partData.
                         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&local_160,
                 (bool *)((long)&newMatch_2.partData.
                                 super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::push_back(&match->partData,&local_218);
    }
    FunctionMatch::FunctionMatch((FunctionMatch *)local_240,match);
    bVar2 = CheckFunctionCallPart
                      (this,parts,partsIndex + 1,endSym_local,(SymbolListCItr)this_local,
                       (FunctionMatch *)local_240);
    if (bVar2) {
      FunctionMatch::operator=(match,(FunctionMatch *)local_240);
      currSym_local._M_current._7_1_ = 1;
      newMatch_1.partData.
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      bVar2 = CheckFunctionCallPart
                        (this,parts,partsIndex,endSym_local,(SymbolListCItr)this_local,
                         (FunctionMatch *)local_240);
      if (bVar2) {
        FunctionMatch::operator=(match,(FunctionMatch *)local_240);
        currSym_local._M_current._7_1_ = 1;
        newMatch_1.partData.
        super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      else {
        newMatch_1.partData.
        super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
    }
    FunctionMatch::~FunctionMatch((FunctionMatch *)local_240);
joined_r0x00165151:
    if ((uint)newMatch_1.partData.
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0016518b;
  }
  sVar4 = std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::size(&match->partData);
  sVar10 = std::
           vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ::size(parts);
  currSym_local._M_current._7_1_ = sVar4 == sVar10;
LAB_0016518b:
  return (bool)(currSym_local._M_current._7_1_ & 1);
}

Assistant:

inline_t bool Parser::CheckFunctionCallPart(const FunctionSignaturePartsI & parts, size_t partsIndex, SymbolListCItr currSym, SymbolListCItr endSym, FunctionMatch & match) const
	{
		// If we reach the end of the parts list, return failure
		if (partsIndex >= parts.size())
			return false;

		// If we've exceeded our range, return failure
		if (currSym == endSym)
			return false;

		const auto & part = parts[partsIndex];

		// Check for invalid symbol
		if (!IsSymbolValid(currSym))
			return part.optional && partsIndex == (parts.size() - 1);

		// Recursively iterate through all parts and match them against the signature.
		if (part.partType == FunctionSignaturePartType::Name)
		{
			if (!part.optional && currSym->type != SymbolType::NameValue && !IsKeyword(currSym->type))
				return false;

			// Attempt to find a matching part name
			bool matchedName = false;
			for (const auto & name : part.names)
			{
				if (name == currSym->text)
				{
					matchedName = true;
					match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 1, part.optional));
					auto newCurrSym = currSym;
					++newCurrSym;
					auto newMatch = match;
					if (CheckFunctionCallPart(parts, partsIndex + 1, newCurrSym, endSym, newMatch))
					{
						match = newMatch;
						return true;
					}
					break;
				}
			}

			// Check if this is an optional part and we haven't yet found a name match
			if (!matchedName && part.optional)
			{
				auto newMatch = match;
				newMatch.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 0, true));
				if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
				{
					match = newMatch;
					return true;
				}
			}
		}
		else
		{
			// Set a flag if this is the initial token in the expression.
			bool isInitialToken = partsIndex >= match.partData.size();

			// Check for valid expressions
			size_t symCount = 0;
			if (CheckVariable(currSym, &symCount) || CheckProperty(currSym, &symCount) || CheckFunctionDeclaration(currSym, &symCount))
			{
				for (size_t i = 0; i < symCount; ++i)
					++currSym;
			}
			else if (currSym->type == SymbolType::ParenOpen)
			{
				size_t parenCount = 1;
				symCount = 1;
				while (parenCount)
				{
					++currSym;
					++symCount;
					if (!IsSymbolValid(currSym))
						return false;
					if (currSym->type == SymbolType::ParenOpen)
						++parenCount;
					else if (currSym->type == SymbolType::ParenClose)
						--parenCount;
				}
				++currSym;
			}
			else if (currSym->type == SymbolType::ParenClose)
			{
				return false;
			}
			else if (IsConstant(currSym->type) || currSym->type == SymbolType::Not)
			{
				++currSym;
				symCount = 1;
			}
			else if (!isInitialToken && (IsOperator(currSym->type) || currSym->type == SymbolType::And || currSym->type == SymbolType::Or))
			{
				++currSym;
				symCount = 1;
			}
			else
			{
				if (partsIndex != 0)
				{
					FunctionMatch exprMatch = CheckFunctionCall(false, currSym, endSym);
					if (exprMatch.signature)
					{
						for (size_t i = 0; i < exprMatch.partData.size(); ++i)
						{
							++currSym;
							++symCount;
						}
					}
					else
					{
						exprMatch = CheckFunctionCall(true, currSym, endSym);
						if (exprMatch.signature)
						{
							for (size_t i = 1; i < exprMatch.partData.size(); ++i)
							{
								++currSym;
								++symCount;
							}
						}
						else
						{
							return false;
						}
					}
				}
				else
				{
					return false;
				}
			}

			// If our match structure isn't up to date, push new match items.  Otherwise,
			// advance our expression token count.  This will be important for determining
			// how many symbols we need to parse for an expression.
			if (isInitialToken)
				match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Parameter, symCount, false));
			else
				std::get<1>(match.partData[partsIndex]) = std::get<1>(match.partData[partsIndex]) + symCount;

			// Store off current match structure
			auto newMatch = match;

			// Check to see if advancing part index leads to success
			if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}

			// Check symbols against the current part.
			if (CheckFunctionCallPart(parts, partsIndex, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}
		}

		return match.partData.size() == parts.size();
	}